

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O0

APInt __thiscall llvm::APInt::getSplat(APInt *this,uint NewLen,APInt *V)

{
  uint uVar1;
  undefined8 extraout_RDX;
  undefined8 uVar2;
  undefined8 extraout_RDX_00;
  APInt AVar3;
  APInt local_38;
  uint local_28;
  undefined1 local_21;
  uint I;
  APInt *V_local;
  APInt *pAStack_10;
  uint NewLen_local;
  APInt *Val;
  
  _I = V;
  V_local._4_4_ = NewLen;
  pAStack_10 = this;
  uVar1 = getBitWidth(V);
  if (NewLen < uVar1) {
    __assert_fail("NewLen >= V.getBitWidth() && \"Can\'t splat to smaller bit width!\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                  ,0x20a,"static APInt llvm::APInt::getSplat(unsigned int, const APInt &)");
  }
  local_21 = 0;
  zextOrSelf(this,(uint)_I);
  local_28 = getBitWidth(_I);
  uVar2 = extraout_RDX;
  for (; local_28 < V_local._4_4_; local_28 = local_28 << 1) {
    operator<<(&local_38,(uint)this);
    operator|=(this,&local_38);
    ~APInt(&local_38);
    uVar2 = extraout_RDX_00;
  }
  AVar3._8_8_ = uVar2;
  AVar3.U.pVal = (uint64_t *)this;
  return AVar3;
}

Assistant:

APInt APInt::getSplat(unsigned NewLen, const APInt &V) {
  assert(NewLen >= V.getBitWidth() && "Can't splat to smaller bit width!");

  APInt Val = V.zextOrSelf(NewLen);
  for (unsigned I = V.getBitWidth(); I < NewLen; I <<= 1)
    Val |= Val << I;

  return Val;
}